

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadImpl.cpp
# Opt level: O0

void __thiscall efsw::Platform::ThreadImpl::terminate(ThreadImpl *this)

{
  bool bVar1;
  ThreadImpl *this_local;
  
  bVar1 = Atomic::operator_cast_to_bool((Atomic *)&this->mIsActive);
  if (bVar1) {
    pthread_cancel(this->mThread);
    Atomic<bool>::operator=(&this->mIsActive,false);
  }
  return;
}

Assistant:

void ThreadImpl::terminate() {
	if ( mIsActive ) {
#if !defined( __ANDROID__ ) && !defined( ANDROID )
		pthread_cancel( mThread );
#else
		pthread_kill( mThread, SIGUSR1 );
#endif

		mIsActive = false;
	}
}